

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O2

void G1_mul(G1 *rop,G1 *op,BIGNUM *scalar,ATE_CTX *ctx)

{
  uchar *puVar1;
  G1 *rop_00;
  G1 *rop_01;
  unsigned_long *dst;
  int iVar2;
  uint uVar3;
  uint uVar4;
  BN_CTX *ctx_00;
  BIGNUM *r;
  unsigned_long *puVar5;
  G1 *rop_02;
  long lVar6;
  G1 *pGVar7;
  G1 *pGVar8;
  ulong uVar9;
  byte bVar10;
  uchar p_str [33];
  uchar table_storage [2080];
  
  bVar10 = 0;
  ctx_00 = BN_CTX_new();
  iVar2 = BN_num_bits((BIGNUM *)scalar);
  if (iVar2 < 0x101) {
    iVar2 = BN_is_negative(scalar);
    r = scalar;
    if (iVar2 != 0) goto LAB_00119c1d;
  }
  else {
LAB_00119c1d:
    r = (BIGNUM *)BN_CTX_get(ctx_00);
    if (r == (BIGNUM *)0x0) goto LAB_0011a087;
    iVar2 = BN_nnmod((BIGNUM *)r,(BIGNUM *)scalar,(BIGNUM *)ctx->order,ctx_00);
    if (iVar2 == 0) goto LAB_0011a087;
  }
  puVar1 = table_storage + 0x18;
  rop_00 = (G1 *)(table_storage + 0x618);
  pGVar7 = (G1 *)(table_storage + 0x678);
  pGVar8 = (G1 *)(table_storage + 0x6d8);
  rop_01 = (G1 *)(table_storage + 0x738);
  rop_02 = (G1 *)(table_storage + 0x798);
  uVar9 = 0;
  while( true ) {
    iVar2 = bn_get_top(r);
    if ((long)(iVar2 << 3) <= (long)uVar9) break;
    puVar5 = bn_get_words(r);
    *(undefined8 *)(p_str + uVar9) = *(undefined8 *)((long)puVar5 + uVar9);
    uVar9 = uVar9 + 8;
  }
  for (; uVar9 < 0x21; uVar9 = uVar9 + 1) {
    p_str[uVar9] = '\0';
  }
  G1_copy(rop_00,op);
  G1_scatter_w5(puVar1,rop_00,1);
  G1_double(pGVar7,rop_00,ctx);
  G1_scatter_w5(puVar1,pGVar7,2);
  G1_add(pGVar8,pGVar7,rop_00,ctx);
  G1_scatter_w5(puVar1,pGVar8,3);
  G1_double(pGVar7,pGVar7,ctx);
  G1_scatter_w5(puVar1,pGVar7,4);
  G1_double(pGVar8,pGVar8,ctx);
  G1_scatter_w5(puVar1,pGVar8,6);
  G1_add(rop_01,pGVar7,rop_00,ctx);
  G1_scatter_w5(puVar1,rop_01,5);
  G1_add(rop_02,pGVar8,rop_00,ctx);
  G1_scatter_w5(puVar1,rop_02,7);
  G1_double(pGVar7,pGVar7,ctx);
  G1_scatter_w5(puVar1,pGVar7,8);
  G1_double(pGVar8,pGVar8,ctx);
  G1_scatter_w5(puVar1,pGVar8,0xc);
  G1_double(rop_01,rop_01,ctx);
  G1_scatter_w5(puVar1,rop_01,10);
  G1_double(rop_02,rop_02,ctx);
  G1_scatter_w5(puVar1,rop_02,0xe);
  G1_add(pGVar8,pGVar8,rop_00,ctx);
  G1_scatter_w5(puVar1,pGVar8,0xd);
  G1_add(rop_01,rop_01,rop_00,ctx);
  G1_scatter_w5(puVar1,rop_01,0xb);
  G1_add(rop_02,rop_02,rop_00,ctx);
  G1_scatter_w5(puVar1,rop_02,0xf);
  G1_add(pGVar8,pGVar7,rop_00,ctx);
  G1_scatter_w5(puVar1,pGVar8,9);
  G1_double(pGVar7,pGVar7,ctx);
  G1_scatter_w5(puVar1,pGVar7,0x10);
  uVar3 = _booth_recode_w5((uint)(p_str[0x1f] >> 6));
  G1_gather_w5(rop_00,puVar1,uVar3 >> 1);
  pGVar7 = rop_00;
  pGVar8 = rop;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    pGVar8->m_x[0].d[0] = pGVar7->m_x[0].d[0];
    pGVar7 = (G1 *)((long)pGVar7 + (ulong)bVar10 * -0x10 + 8);
    pGVar8 = (G1 *)((long)pGVar8 + (ulong)bVar10 * -0x10 + 8);
  }
  puVar5 = (unsigned_long *)(table_storage + 0x698);
  dst = (unsigned_long *)(table_storage + 0x638);
  for (uVar3 = 0xfe; 4 < uVar3 + 1; uVar3 = uVar3 - 5) {
    if (uVar3 != 0xfe) {
      uVar4 = _booth_recode_w5(*(ushort *)(p_str + (uVar3 >> 3)) >> ((byte)uVar3 & 7) & 0x3f);
      G1_gather_w5(rop_00,puVar1,uVar4 >> 1);
      fp_neg(puVar5,dst,ctx->p);
      copy_conditional(dst,puVar5,(ulong)(uVar4 & 1));
      G1_add(rop,rop,rop_00,ctx);
    }
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
    G1_double(rop,rop,ctx);
  }
  uVar3 = _booth_recode_w5(p_str._0_4_ * 2 & 0x3e);
  G1_gather_w5(rop_00,puVar1,uVar3 >> 1);
  fp_neg(puVar5,dst,ctx->p);
  copy_conditional(dst,puVar5,(ulong)(uVar3 & 1));
  G1_add(rop,rop,rop_00,ctx);
LAB_0011a087:
  BN_CTX_free(ctx_00);
  return;
}

Assistant:

void G1_mul(G1 *rop, const G1 *op, const BIGNUM *scalar, const ATE_CTX *ctx)
{
    // int i;
    // G1 r;
    // G1_set(&r, op);

    // for(i = BN_num_bits(scalar) - 1; i > 0; i--)
    // {
    //     G1_double(&r, &r, ctx);
    //     if(BN_is_bit_set(scalar, i - 1)) 
    //     {
    //         G1_add(&r, &r, op, ctx);
    //     }
    // }
    // G1_set(rop, &r);
    G1_windowed_mul(rop, scalar, op, ctx);
}